

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O0

void __thiscall
FxConstant::FxConstant(FxConstant *this,PType *type,VMValue *vmval,FScriptPosition *pos)

{
  FString *str;
  ExpVal local_48 [2];
  FScriptPosition *local_28;
  FScriptPosition *pos_local;
  VMValue *vmval_local;
  PType *type_local;
  FxConstant *this_local;
  
  local_28 = pos;
  pos_local = (FScriptPosition *)vmval;
  vmval_local = (VMValue *)type;
  type_local = (PType *)this;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00a0ba60;
  ExpVal::ExpVal(&this->value);
  (this->value).Type = (PType *)vmval_local;
  (this->super_FxExpression).ValueType = (PType *)vmval_local;
  (this->super_FxExpression).isresolved = true;
  switch(pos_local->field_0xc) {
  default:
    (this->value).field_1.Int = *(int *)&(pos_local->FileName).Chars;
    break;
  case 1:
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(pos_local->FileName).Chars;
    break;
  case 2:
    str = VMValue::s((VMValue *)pos_local);
    ExpVal::ExpVal(local_48,str);
    ExpVal::operator=(&this->value,local_48);
    ExpVal::~ExpVal(local_48);
    break;
  case 3:
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(pos_local->FileName).Chars;
  }
  return;
}

Assistant:

FxConstant(PType *type, VMValue &vmval, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = type;
		isresolved = true;
		switch (vmval.Type)
		{
		default:
		case REGT_INT:
			value.Int = vmval.i;
			break;

		case REGT_FLOAT:
			value.Float = vmval.f;
			break;

		case REGT_STRING:
			value = ExpVal(vmval.s());
			break;

		case REGT_POINTER:
			value.pointer = vmval.a;
			break;
		}
	}